

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS
ref_phys_viscous(REF_DBL *state,REF_DBL *grad,REF_DBL turb,REF_DBL mach,REF_DBL re,
                REF_DBL reference_temp,REF_DBL *dir,REF_DBL *flux)

{
  uint uVar1;
  double dVar2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL dtdx;
  REF_DBL thermal_conductivity;
  int local_120;
  REF_INT k;
  REF_INT j;
  REF_INT i;
  REF_DBL qdot [3];
  double local_f8;
  REF_DBL tau [3] [3];
  REF_DBL turbulent_pr;
  REF_DBL pr;
  REF_DBL gamma;
  REF_DBL t;
  REF_DBL mu_t;
  REF_DBL mu;
  REF_DBL p;
  REF_DBL w;
  REF_DBL v;
  REF_DBL u;
  REF_DBL rho;
  REF_DBL *flux_local;
  REF_DBL *dir_local;
  REF_DBL reference_temp_local;
  REF_DBL re_local;
  REF_DBL mach_local;
  REF_DBL turb_local;
  REF_DBL *grad_local;
  REF_DBL *state_local;
  
  u = *state;
  v = state[1];
  w = state[2];
  p = state[3];
  mu = state[4];
  rho = (REF_DBL)flux;
  flux_local = dir;
  dir_local = (REF_DBL *)reference_temp;
  reference_temp_local = re;
  re_local = mach;
  mach_local = turb;
  turb_local = (REF_DBL)grad;
  grad_local = state;
  uVar1 = viscosity_law((mu * 1.4) / u,reference_temp,&mu_t);
  if (uVar1 == 0) {
    uVar1 = ref_phys_mut_sa(mach_local,u,mu_t / u,&t);
    if (uVar1 == 0) {
      dVar2 = mu_t / 0.2879999999999999;
      mu_t = (re_local / reference_temp_local) * (t + mu_t);
      for (k = 0; k < 3; k = k + 1) {
        for (local_120 = 0; local_120 < 3; local_120 = local_120 + 1) {
          tau[(long)k + -1][(long)local_120 + 2] =
               mu_t * (*(double *)((long)turb_local + (long)(local_120 + (k + 1) * 3) * 8) +
                      *(double *)((long)turb_local + (long)(k + (local_120 + 1) * 3) * 8));
        }
        for (thermal_conductivity._4_4_ = 0; thermal_conductivity._4_4_ < 3;
            thermal_conductivity._4_4_ = thermal_conductivity._4_4_ + 1) {
          tau[(long)k + -1][(long)k + 2] =
               mu_t * -0.6666666666666666 *
               *(double *)((long)turb_local + (long)(thermal_conductivity._4_4_ * 4 + 3) * 8) +
               tau[(long)k + -1][(long)k + 2];
        }
      }
      for (k = 0; k < 3; k = k + 1) {
        *(double *)(&j + (long)k * 2) =
             (re_local / reference_temp_local) * -(dVar2 + t / 0.35999999999999993) *
             ((((*(double *)((long)turb_local + (long)(k + 0xc) * 8) * u +
                -(mu * *(double *)((long)turb_local + (long)k * 8))) * 1.4) / u) / u);
      }
      *(undefined8 *)rho = 0;
      *(double *)((long)rho + 8) =
           flux_local[2] * tau[0][1] + *flux_local * local_f8 + flux_local[1] * tau[0][0];
      *(double *)((long)rho + 0x10) =
           flux_local[2] * tau[1][1] + *flux_local * tau[0][2] + flux_local[1] * tau[1][0];
      *(double *)((long)rho + 0x18) =
           flux_local[2] * tau[2][1] + *flux_local * tau[1][2] + flux_local[1] * tau[2][0];
      *(double *)((long)rho + 0x20) =
           flux_local[2] * ((p * tau[2][1] + v * tau[1][2] + w * tau[2][0]) - qdot[1]) +
           *flux_local * ((p * tau[0][1] + v * local_f8 + w * tau[0][0]) - _j) +
           flux_local[1] * ((p * tau[1][1] + v * tau[0][2] + w * tau[1][0]) - qdot[0]);
      state_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0xfb,
             "ref_phys_viscous",(ulong)uVar1,"eddy viscosity");
      state_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0xfa,
           "ref_phys_viscous",(ulong)uVar1,"sutherlands");
    state_local._4_4_ = uVar1;
  }
  return state_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_phys_viscous(REF_DBL *state, REF_DBL *grad, REF_DBL turb,
                                    REF_DBL mach, REF_DBL re,
                                    REF_DBL reference_temp, REF_DBL *dir,
                                    REF_DBL *flux) {
  REF_DBL rho, u, v, w, p, mu, mu_t, t;
  REF_DBL gamma = 1.4;
  REF_DBL pr = 0.72;
  REF_DBL turbulent_pr = 0.90;
  REF_DBL tau[3][3], qdot[3];
  REF_INT i, j, k;
  REF_DBL thermal_conductivity, dtdx;

  rho = state[0];
  u = state[1];
  v = state[2];
  w = state[3];
  p = state[4];
  t = gamma * p / rho;

  RSS(viscosity_law(t, reference_temp, &mu), "sutherlands");
  RSS(ref_phys_mut_sa(turb, rho, mu / rho, &mu_t), "eddy viscosity");
  thermal_conductivity =
      -(mu / (pr * (gamma - 1.0)) + mu_t / (turbulent_pr * (gamma - 1.0)));
  mu += mu_t;

  mu *= mach / re;
  thermal_conductivity *= mach / re;

  for (i = 0; i < 3; i++) {
    for (j = 0; j < 3; j++) {
      tau[i][j] = mu * (grad[j + 3 * (1 + i)] + grad[i + 3 * (1 + j)]);
    }
    for (k = 0; k < 3; k++) {
      tau[i][i] += (-2.0 / 3.0) * mu * grad[k + 3 * (1 + k)];
    }
  }

  for (i = 0; i < 3; i++) {
    /* t = gamma * p / rho quotient rule */
    dtdx = gamma * (grad[i + 3 * 4] * rho - p * grad[i + 3 * 0]) / rho / rho;
    qdot[i] = thermal_conductivity * dtdx;
  }

  flux[0] = 0.0;
  flux[1] = dir[0] * tau[0][0] + dir[1] * tau[0][1] + dir[2] * tau[0][2];
  flux[2] = dir[0] * tau[1][0] + dir[1] * tau[1][1] + dir[2] * tau[1][2];
  flux[3] = dir[0] * tau[2][0] + dir[1] * tau[2][1] + dir[2] * tau[2][2];
  flux[4] = dir[0] * (u * tau[0][0] + v * tau[0][1] + w * tau[0][2] - qdot[0]) +
            dir[1] * (u * tau[1][0] + v * tau[1][1] + w * tau[1][2] - qdot[1]) +
            dir[2] * (u * tau[2][0] + v * tau[2][1] + w * tau[2][2] - qdot[2]);

  return REF_SUCCESS;
}